

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::Chapter::Display::WriteDisplay(Display *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 value;
  uint64 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar5;
  uint64_t uVar6;
  
  value = EbmlElementSize(0x85,this->title_);
  if (this->language_ != (char *)0x0) {
    uVar4 = EbmlElementSize(0x437c,this->language_);
    value = value + uVar4;
  }
  if (this->country_ != (char *)0x0) {
    uVar4 = EbmlElementSize(0x437e,this->country_);
    value = value + uVar4;
  }
  uVar4 = EbmlMasterElementSize(0x80,value);
  uVar6 = uVar4 + value;
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    bVar1 = WriteEbmlMasterElement(writer,0x80,value);
    if ((((bVar1) && (bVar1 = WriteEbmlElement(writer,0x85,this->title_), bVar1)) &&
        ((this->language_ == (char *)0x0 ||
         (bVar1 = WriteEbmlElement(writer,0x437c,this->language_), bVar1)))) &&
       ((this->country_ == (char *)0x0 ||
        (bVar1 = WriteEbmlElement(writer,0x437e,this->country_), bVar1)))) {
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      uVar5 = 0;
      if (CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar6) {
        uVar5 = uVar6;
      }
      if (CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) {
        uVar6 = uVar5;
      }
    }
    else {
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

uint64_t Chapter::Display::WriteDisplay(IMkvWriter* writer) const {
  uint64_t payload_size = EbmlElementSize(libwebm::kMkvChapString, title_);

  if (language_)
    payload_size += EbmlElementSize(libwebm::kMkvChapLanguage, language_);

  if (country_)
    payload_size += EbmlElementSize(libwebm::kMkvChapCountry, country_);

  const uint64_t display_size =
      EbmlMasterElementSize(libwebm::kMkvChapterDisplay, payload_size) +
      payload_size;

  if (writer == NULL)
    return display_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvChapterDisplay,
                              payload_size))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapString, title_))
    return 0;

  if (language_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvChapLanguage, language_))
      return 0;
  }

  if (country_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvChapCountry, country_))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != display_size)
    return 0;

  return display_size;
}